

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void assessColPrimalSolution
               (HighsOptions *options,double primal,double lower,double upper,HighsVarType type,
               double *col_infeasibility,double *integer_infeasibility)

{
  ulong uVar1;
  double dVar2;
  
  *col_infeasibility = 0.0;
  dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  if (lower - dVar2 <= primal) {
    if (primal <= dVar2 + upper) goto LAB_002479d3;
    dVar2 = primal - upper;
  }
  else {
    dVar2 = lower - primal;
  }
  *col_infeasibility = dVar2;
LAB_002479d3:
  dVar2 = 0.0;
  if ((type & ~kSemiContinuous) == kInteger) {
    dVar2 = round(primal);
    dVar2 = ABS(primal - dVar2);
  }
  *integer_infeasibility = dVar2;
  if (((type & ~kInteger) == kSemiContinuous) && (0.0 < *col_infeasibility)) {
    if (ABS(primal) <= (options->super_HighsOptionsStruct).mip_feasibility_tolerance) {
      *col_infeasibility = 0.0;
    }
    if (primal < upper) {
      dVar2 = *col_infeasibility;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        uVar1 = -(ulong)(dVar2 < *integer_infeasibility);
        *integer_infeasibility =
             (double)(~uVar1 & (ulong)*col_infeasibility | (ulong)*integer_infeasibility & uVar1);
      }
    }
  }
  return;
}

Assistant:

void assessColPrimalSolution(const HighsOptions& options, const double primal,
                             const double lower, const double upper,
                             const HighsVarType type, double& col_infeasibility,
                             double& integer_infeasibility) {
  // @primal_infeasibility calculation
  col_infeasibility = 0;
  if (primal < lower - options.primal_feasibility_tolerance) {
    col_infeasibility = lower - primal;
  } else if (primal > upper + options.primal_feasibility_tolerance) {
    col_infeasibility = primal - upper;
  }
  integer_infeasibility = 0;
  if (type == HighsVarType::kInteger || type == HighsVarType::kSemiInteger) {
    integer_infeasibility = fractionality(primal);
  }
  if (col_infeasibility > 0 && (type == HighsVarType::kSemiContinuous ||
                                type == HighsVarType::kSemiInteger)) {
    // Semi-variables at zero will have positive col
    // infeasibility, so possibly zero this
    if (std::fabs(primal) <= options.mip_feasibility_tolerance)
      col_infeasibility = 0;
    // If there is (still) column infeasibility due to value being
    // off zero or below lower bound, then this counts as an integer
    // infeasibility
    if (col_infeasibility && primal < upper)
      integer_infeasibility =
          std::max(col_infeasibility, integer_infeasibility);
  }
}